

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O0

void __thiscall ED::ComputeGradient(ED *this)

{
  short sVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  int local_3c;
  int index;
  int sum;
  int com2_1;
  int com1_1;
  int gy;
  int gx;
  int com2;
  int com1;
  int j_1;
  int i_1;
  int i;
  int j;
  ED *this_local;
  
  for (i_1 = 0; i_1 < this->width; i_1 = i_1 + 1) {
    sVar1 = (short)this->gradThresh + -1;
    this->gradImg[(this->height + -1) * this->width + i_1] = sVar1;
    this->gradImg[i_1] = sVar1;
  }
  for (j_1 = 1; j_1 < this->height + -1; j_1 = j_1 + 1) {
    sVar1 = (short)this->gradThresh + -1;
    this->gradImg[(j_1 + 1) * this->width + -1] = sVar1;
    this->gradImg[j_1 * this->width] = sVar1;
  }
  for (com1 = 1; com1 < this->height + -1; com1 = com1 + 1) {
    for (com2 = 1; com2 < this->width + -1; com2 = com2 + 1) {
      iVar2 = (uint)this->smoothImg[(long)((com1 + 1) * this->width + com2) + 1] -
              (uint)this->smoothImg[(com1 + -1) * this->width + -1 + com2];
      iVar3 = (uint)this->smoothImg[(long)((com1 + -1) * this->width + com2) + 1] -
              (uint)this->smoothImg[(com1 + 1) * this->width + -1 + com2];
      switch(this->op) {
      case PREWITT_OPERATOR:
        com1_1 = iVar2 + iVar3 +
                 ((uint)this->smoothImg[com1 * this->width + com2 + 1] -
                 (uint)this->smoothImg[com1 * this->width + com2 + -1]);
        if (com1_1 < 1) {
          com1_1 = -com1_1;
        }
        com2_1 = (iVar2 - iVar3) +
                 ((uint)this->smoothImg[(com1 + 1) * this->width + com2] -
                 (uint)this->smoothImg[(com1 + -1) * this->width + com2]);
        if (com2_1 < 1) {
          com2_1 = -com2_1;
        }
        break;
      case SOBEL_OPERATOR:
        com1_1 = iVar2 + iVar3 +
                 ((uint)this->smoothImg[com1 * this->width + com2 + 1] -
                 (uint)this->smoothImg[com1 * this->width + com2 + -1]) * 2;
        if (com1_1 < 1) {
          com1_1 = -com1_1;
        }
        com2_1 = (iVar2 - iVar3) +
                 ((uint)this->smoothImg[(com1 + 1) * this->width + com2] -
                 (uint)this->smoothImg[(com1 + -1) * this->width + com2]) * 2;
        if (com2_1 < 1) {
          com2_1 = -com2_1;
        }
        break;
      case SCHARR_OPERATOR:
        com1_1 = (iVar2 + iVar3) * 3 +
                 ((uint)this->smoothImg[com1 * this->width + com2 + 1] -
                 (uint)this->smoothImg[com1 * this->width + com2 + -1]) * 10;
        if (com1_1 < 1) {
          com1_1 = -com1_1;
        }
        com2_1 = (iVar2 - iVar3) * 3 +
                 ((uint)this->smoothImg[(com1 + 1) * this->width + com2] -
                 (uint)this->smoothImg[(com1 + -1) * this->width + com2]) * 10;
        if (com2_1 < 1) {
          com2_1 = -com2_1;
        }
        break;
      case LSD_OPERATOR:
        iVar2 = (uint)this->smoothImg[(com1 + 1) * this->width + com2 + 1] -
                (uint)this->smoothImg[com1 * this->width + com2];
        iVar3 = (uint)this->smoothImg[com1 * this->width + com2 + 1] -
                (uint)this->smoothImg[(com1 + 1) * this->width + com2];
        com1_1 = iVar2 + iVar3;
        if (com1_1 < 1) {
          com1_1 = -com1_1;
        }
        com2_1 = iVar2 - iVar3;
        if (com2_1 < 1) {
          com2_1 = -com2_1;
        }
      }
      if ((this->sumFlag & 1U) == 0) {
        dVar4 = sqrt((double)com1_1 * (double)com1_1 + (double)(com2_1 * com2_1));
        local_3c = (int)dVar4;
      }
      else {
        local_3c = com1_1 + com2_1;
      }
      iVar2 = com1 * this->width + com2;
      this->gradImg[iVar2] = (short)local_3c;
      if (this->gradThresh <= local_3c) {
        if (com1_1 < com2_1) {
          this->dirImg[iVar2] = '\x02';
        }
        else {
          this->dirImg[iVar2] = '\x01';
        }
      }
    }
  }
  return;
}

Assistant:

void ED::ComputeGradient()
{	
	// Initialize gradient image for row = 0, row = height-1, column=0, column=width-1 
	for (int j = 0; j<width; j++) { gradImg[j] = gradImg[(height - 1)*width + j] = gradThresh - 1; }
	for (int i = 1; i<height - 1; i++) { gradImg[i*width] = gradImg[(i + 1)*width - 1] = gradThresh - 1; }

	for (int i = 1; i<height - 1; i++) {
		for (int j = 1; j<width - 1; j++) {
			// Prewitt Operator in horizontal and vertical direction
			// A B C
			// D x E
			// F G H
			// gx = (C-A) + (E-D) + (H-F)
			// gy = (F-A) + (G-B) + (H-C)
			//
			// To make this faster: 
			// com1 = (H-A)
			// com2 = (C-F)
			// 
			// For Prewitt
			// Then: gx = com1 + com2 + (E-D) = (H-A) + (C-F) + (E-D) = (C-A) + (E-D) + (H-F)
			//       gy = com1 - com2 + (G-B) = (H-A) - (C-F) + (G-B) = (F-A) + (G-B) + (H-C)
			// 
			// For Sobel
			// Then: gx = com1 + com2 + 2*(E-D) = (H-A) + (C-F) + 2*(E-D) = (C-A) + 2*(E-D) + (H-F)
			//       gy = com1 - com2 + 2*(G-B) = (H-A) - (C-F) + 2*(G-B) = (F-A) + 2*(G-B) + (H-C)
			//
			// For Scharr
			// Then: gx = 3*(com1 + com2) + 10*(E-D) = 3*(H-A) + 3*(C-F) + 10*(E-D) = 3*(C-A) + 10*(E-D) + 3*(H-F)
			//       gy = 3*(com1 - com2) + 10*(G-B) = 3*(H-A) - 3*(C-F) + 10*(G-B) = 3*(F-A) + 10*(G-B) + 3*(H-C)
			//
			// For LSD
			// A B
			// C D
			// gx = (B-A) + (D-C)
			// gy = (C-A) + (D-B)
			//
			// To make this faster: 
			// com1 = (D-A)
			// com2 = (B-C)
			// Then: gx = com1 + com2 = (D-A) + (B-C) = (B-A) + (D-C)
			//       gy = com1 - com2 = (D-A) - (B-C) = (C-A) + (D-B)

			int com1 = smoothImg[(i + 1)*width + j + 1] - smoothImg[(i - 1)*width + j - 1];
			int com2 = smoothImg[(i - 1)*width + j + 1] - smoothImg[(i + 1)*width + j - 1];

			int gx;
			int gy;
			
			switch (op)
			{
			case PREWITT_OPERATOR:
				gx = abs(com1 + com2 + (smoothImg[i*width + j + 1] - smoothImg[i*width + j - 1]));
				gy = abs(com1 - com2 + (smoothImg[(i + 1)*width + j] - smoothImg[(i - 1)*width + j]));
				break;
			case SOBEL_OPERATOR:
				gx = abs(com1 + com2 + 2 * (smoothImg[i*width + j + 1] - smoothImg[i*width + j - 1]));
				gy = abs(com1 - com2 + 2 * (smoothImg[(i + 1)*width + j] - smoothImg[(i - 1)*width + j]));
				break;
			case SCHARR_OPERATOR:
				gx = abs(3 * (com1 + com2) + 10 * (smoothImg[i*width + j + 1] - smoothImg[i*width + j - 1]));
				gy = abs(3 * (com1 - com2) + 10 * (smoothImg[(i + 1)*width + j] - smoothImg[(i - 1)*width + j]));
				break;
			case LSD_OPERATOR:
				// com1 and com2 differs from previous operators, because LSD has 2x2 kernel
				int com1 = smoothImg[(i + 1)*width + j + 1] - smoothImg[i*width + j];
				int com2 = smoothImg[i*width + j + 1] - smoothImg[(i + 1)*width + j];

				gx = abs(com1 + com2);
				gy = abs(com1 - com2);
			}
			
			int sum;

			if(sumFlag)
				sum = gx + gy;
			else
				sum = (int)sqrt((double)gx*gx + gy*gy);

			int index = i*width + j;
			gradImg[index] = sum;

			if (sum >= gradThresh) {
				if (gx >= gy) dirImg[index] = EDGE_VERTICAL;
				else          dirImg[index] = EDGE_HORIZONTAL;
			} //end-if
		} // end-for
	} // end-for
}